

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

void __thiscall
nonsugar::detail::parse_flag_long<std::__cxx11::string,void,void>::operator()
          (parse_flag_long<std::__cxx11::string,void,void> *this,
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *match,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *param_2,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          param_3,shared_ptr<void> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>
          *param_5,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  long *plVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer psVar5;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  string_type local_58;
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  psVar2 = (match->
           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ).
           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (match->
           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ).
           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 == psVar5) {
    bVar8 = false;
  }
  else {
    bVar8 = ((long)psVar5 - (long)psVar2 >> 3) * -0x5555555555555555 - 6U < 0xfffffffffffffffd;
  }
  psVar5 = psVar5 + -3;
  if (bVar8) {
    psVar5 = psVar2 + 2;
  }
  if (psVar5->matched != true) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0013a868;
    *(undefined4 *)&p_Var4[1]._vptr__Sp_counted_base = 0;
    (value->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = p_Var4 + 1;
    this_00 = (value->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (value->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var4;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"argument not allowed: ","");
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_58,match,0);
  uVar6 = 0xf;
  if (local_38 != local_28) {
    uVar6 = local_28[0];
  }
  if (uVar6 < local_58._M_string_length + local_30) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar7 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_30 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
      goto LAB_0012c913;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58._M_dataplus._M_p);
LAB_0012c913:
  local_78 = &local_68;
  plVar1 = puVar3 + 2;
  if ((long *)*puVar3 == plVar1) {
    local_68 = *plVar1;
    uStack_60 = puVar3[3];
  }
  else {
    local_68 = *plVar1;
    local_78 = (long *)*puVar3;
  }
  local_70 = puVar3[1];
  *puVar3 = plVar1;
  puVar3[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::operator=((string *)err,(string *)&local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void operator()(
        std::match_results<typename String::const_iterator> const &match, Iterator &, Iterator,
        std::shared_ptr<void> &value, Flag const &, String &err) const
    {
        if (match[2].matched) {
            err = widen<String>("argument not allowed: ") + match.str(0);
            return;
        }
        value = std::make_shared<int>();
    }